

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O2

void __thiscall PFData::PFData(PFData *this,double *data,int nz,int ny,int nx)

{
  allocator local_11;
  
  (this->m_filename)._M_dataplus._M_p = (pointer)&(this->m_filename).field_2;
  (this->m_filename)._M_string_length = 0;
  (this->m_filename).field_2._M_local_buf[0] = '\0';
  this->m_fp = (FILE *)0x0;
  this->m_Z = 0.0;
  this->m_Y = 0.0;
  this->m_X = 0.0;
  this->m_nz = nz;
  this->m_ny = ny;
  this->m_nx = nx;
  this->m_dZ = 1.0;
  this->m_dY = 1.0;
  this->m_dX = 1.0;
  this->m_numSubgrids = 0;
  this->m_r = 1;
  this->m_q = 1;
  this->m_p = 1;
  std::__cxx11::string::string((string *)&this->m_indexOrder,"zyx",&local_11);
  this->m_dataOwner = false;
  this->m_data = data;
  return;
}

Assistant:

PFData::PFData(double *data, int nz, int ny, int nx)
    : m_data{data}, m_nz{nz}, m_ny{ny}, m_nx{nx} {}